

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O2

char * __thiscall
sentencepiece::SentencePieceText_SentencePiece::_InternalParse
          (SentencePieceText_SentencePiece *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint32 uVar2;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar3;
  char cVar4;
  uint32 tag;
  char *local_50;
  InternalMetadata *local_48;
  uint local_3c;
  ExtensionSet *local_38;
  
  local_48 = &(this->super_MessageLite)._internal_metadata_;
  local_38 = &this->_extensions_;
  uVar3 = 0;
  local_50 = ptr;
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_50);
    if (bVar1) goto LAB_001b8366;
    local_50 = google::protobuf::internal::ReadTag(local_50,&local_3c,0);
    tag_00 = local_3c;
    if (local_50 == (char *)0x0) break;
    cVar4 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar4 != '\n') break;
      s = _internal_mutable_piece_abi_cxx11_(this);
LAB_001b827f:
      local_50 = google::protobuf::internal::InlineGreedyStringParser(s,local_50,ctx);
      goto joined_r0x001b82d4;
    case 2:
      if (cVar4 == '\x10') {
        uVar3 = uVar3 | 4;
        uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
        this->id_ = uVar2;
        goto joined_r0x001b82d4;
      }
      break;
    case 3:
      if (cVar4 == '\x1a') {
        s = _internal_mutable_surface_abi_cxx11_(this);
        goto LAB_001b827f;
      }
      break;
    case 4:
      if (cVar4 == ' ') {
        uVar3 = uVar3 | 8;
        uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
        this->begin_ = uVar2;
        goto joined_r0x001b82d4;
      }
      break;
    case 5:
      if (cVar4 == '(') {
        uVar3 = uVar3 | 0x10;
        uVar2 = google::protobuf::internal::ReadVarint32(&local_50);
        this->end_ = uVar2;
        goto joined_r0x001b82d4;
      }
    }
    if (((ulong)local_3c == 0) || ((local_3c & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      goto LAB_001b8366;
    }
    if (local_3c < 0x640) {
      if (((ulong)local_48->ptr_ & 1) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(local_48);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (((ulong)local_48->ptr_ & 0xfffffffffffffffe) + 8);
      }
      local_50 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_50,ctx);
    }
    else {
      local_50 = google::protobuf::internal::ExtensionSet::ParseField
                           (local_38,(ulong)local_3c,local_50,
                            (MessageLite *)_SentencePieceText_SentencePiece_default_instance_,
                            local_48,ctx);
    }
joined_r0x001b82d4:
  } while (local_50 != (char *)0x0);
  local_50 = (char *)0x0;
LAB_001b8366:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar3;
  return local_50;
}

Assistant:

const char* SentencePieceText_SentencePiece::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string piece = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_piece();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint32 id = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_id(&has_bits);
          id_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string surface = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_surface();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint32 begin = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_begin(&has_bits);
          begin_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint32 end = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}